

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

void Sfm_ObjSetupSimInfo(Abc_Obj_t *pObj)

{
  Sfm_Dec_t *p;
  int iVar1;
  int iVar2;
  word *pwVar3;
  word wVar4;
  ulong uVar5;
  word in_RDX;
  word Fill;
  long lVar6;
  int (*paiVar7) [64];
  size_t __size;
  ulong uVar8;
  bool bVar9;
  int Indexes [2] [64];
  
  p = (Sfm_Dec_t *)pObj->pNtk->pData;
  p->nPats[0] = 0;
  p->nPats[1] = 0;
  p->nPatWords[0] = 0;
  p->nPatWords[1] = 0;
  Vec_WrdFill(p->vSets,p->nDivs << 3,in_RDX);
  Vec_WrdFill(p->vSets + 1,p->nDivs << 3,Fill);
  iVar1 = ((p->nDivs >> 4) + 1) - (uint)((p->nDivs & 0xfU) == 0);
  p->nDivWords = iVar1;
  if (p->nDivWordsAlloc < iVar1) {
    iVar2 = 0x10;
    if (0x10 < iVar1) {
      iVar2 = iVar1;
    }
    p->nDivWordsAlloc = iVar2;
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
      __size = (long)p->nDivWordsAlloc << 3;
      if (p->pDivWords[lVar6] == (word *)0x0) {
        pwVar3 = (word *)malloc(__size);
      }
      else {
        pwVar3 = (word *)realloc(p->pDivWords[lVar6],__size);
      }
      p->pDivWords[lVar6] = pwVar3;
    }
    iVar1 = p->nDivWords;
  }
  memset(p->pDivWords[0],0,(long)iVar1 << 3);
  if ((p->pPars->fUseSim != 0) && (uVar8 = p->uCareSet, uVar8 != 0)) {
    wVar4 = Sfm_DecObjSim(p,pObj);
    if (p->iTarget != (pObj->field_6).iTemp) {
      __assert_fail("p->iTarget == pObj->iTemp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                    ,0x195,"void Sfm_ObjSetupSimInfo(Abc_Obj_t *)");
    }
    if (p->pPars->fUseSim == 0) {
      __assert_fail("p->pPars->fUseSim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                    ,0x196,"void Sfm_ObjSetupSimInfo(Abc_Obj_t *)");
    }
    for (uVar5 = 0; uVar5 != 0x40; uVar5 = uVar5 + 1) {
      if ((uVar8 >> (uVar5 & 0x3f) & 1) != 0) {
        bVar9 = (~wVar4 >> (uVar5 & 0x3f) & 1) != 0;
        iVar1 = p->nPats[bVar9];
        p->nPats[bVar9] = iVar1 + 1;
        Indexes[bVar9][iVar1] = (int)uVar5;
      }
    }
    for (lVar6 = 0x78; lVar6 != 0x7a; lVar6 = lVar6 + 1) {
      p->GateAnd[lVar6 + -0x1e] = (p->GateAnd[lVar6 + -0x20] >> 6) + 1;
    }
    for (iVar1 = 0; iVar1 < p->nDivs; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(&p->vObjMap,iVar1);
      wVar4 = Vec_WrdEntry(&p->vObjSims,iVar2);
      paiVar7 = Indexes;
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        for (uVar8 = 0; (long)uVar8 < (long)p->nPats[lVar6]; uVar8 = uVar8 + 1) {
          if ((wVar4 >> ((ulong)(uint)(*paiVar7)[uVar8] & 0x3f) & 1) != 0) {
            pwVar3 = Sfm_DecDivPats(p,iVar1,(int)lVar6);
            pwVar3[uVar8 >> 6 & 0x3ffffff] =
                 pwVar3[uVar8 >> 6 & 0x3ffffff] | 1L << ((byte)uVar8 & 0x3f);
          }
        }
        paiVar7 = paiVar7 + 1;
      }
    }
  }
  return;
}

Assistant:

static inline void Sfm_ObjSetupSimInfo( Abc_Obj_t * pObj )
{
    Sfm_Dec_t * p = Sfm_DecMan( pObj ); int i;
    p->nPats[0]     = p->nPats[1] = 0;
    p->nPatWords[0] = p->nPatWords[1] = 0;
    Vec_WrdFill( &p->vSets[0], p->nDivs*SFM_SIM_WORDS, 0 );
    Vec_WrdFill( &p->vSets[1], p->nDivs*SFM_SIM_WORDS, 0 );
    // alloc divwords
    p->nDivWords = Abc_Bit6WordNum( 4 * p->nDivs );
    if ( p->nDivWordsAlloc < p->nDivWords )
    {
        p->nDivWordsAlloc = Abc_MaxInt( 16, p->nDivWords );
        for ( i = 0; i < SFM_SUPP_MAX; i++ )
            p->pDivWords[i] = ABC_REALLOC( word, p->pDivWords[i], p->nDivWordsAlloc );
    }
    memset( p->pDivWords[0], 0, sizeof(word) * p->nDivWords );
    // collect simulation info
    if ( p->pPars->fUseSim && p->uCareSet != 0 )
    {
        word uCareSet = p->uCareSet;
        word uValues  = Sfm_DecObjSim(p, pObj);
        int c, d, i, Indexes[2][64];
        assert( p->iTarget == pObj->iTemp );
        assert( p->pPars->fUseSim );
        // find what patterns go to on-set/off-set
        for ( i = 0; i < 64; i++ )
            if ( (uCareSet >> i) & 1 )
            {
                c = !((uValues >> i) & 1);
                Indexes[c][p->nPats[c]++] = i;
            }
        for ( c = 0; c < 2; c++ )
            p->nPatWords[c] = 1 + (p->nPats[c] >> 6);
        // write patterns
        for ( d = 0; d < p->nDivs; d++ )
        {
            word uSim = Vec_WrdEntry( &p->vObjSims, Vec_IntEntry(&p->vObjMap, d) );
            for ( c = 0; c < 2; c++ )
                for ( i = 0; i < p->nPats[c]; i++ )
                    if ( (uSim >> Indexes[c][i]) & 1 )
                        Abc_TtSetBit( Sfm_DecDivPats(p, d, c), i );
        }
        //printf( "Node %d : Onset = %d. Offset = %d.\n", pObj->Id, p->nPats[0], p->nPats[1] );
    }
}